

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# post.cpp
# Opt level: O2

Request * __thiscall
Post::PostFixture::parse(Request *__return_storage_ptr__,PostFixture *this,char *s,size_t size)

{
  ParseResult PVar1;
  undefined1 local_d8 [8];
  Request request;
  HttpRequestParser parser;
  
  local_d8 = (undefined1  [8])&request.method._M_string_length;
  request.method._M_dataplus._M_p = (pointer)0x0;
  request.method._M_string_length._0_1_ = 0;
  request.method.field_2._8_8_ = &request.uri._M_string_length;
  request.uri._M_dataplus._M_p = (pointer)0x0;
  request.uri._M_string_length._0_1_ = 0;
  request.uri.field_2._8_8_ = 0;
  request.versionMajor = 0;
  request.versionMinor = 0;
  request.headers.
  super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  request.headers.
  super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  request.keepAlive = false;
  request._121_3_ = 0;
  parser.state = RequestMethodStart;
  parser._4_4_ = 0;
  parser.contentSize = (size_t)&parser.chunkSizeStr._M_string_length;
  parser.chunkSizeStr._M_dataplus._M_p = (pointer)0x0;
  parser.chunkSizeStr._M_string_length._0_1_ = 0;
  parser.chunkSizeStr.field_2._8_8_ = 0;
  request.headers.
  super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0;
  request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._1_7_ = 0;
  request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _9_8_ = 0;
  parser.chunkSize._0_1_ = 0;
  PVar1 = httpparser::HttpRequestParser::consume
                    ((HttpRequestParser *)&request.keepAlive,(Request *)local_d8,s,s + size);
  if (PVar1 == ParsingCompleted) {
    httpparser::Request::Request(__return_storage_ptr__,(Request *)local_d8);
  }
  else {
    (__return_storage_ptr__->method)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->method).field_2;
    (__return_storage_ptr__->method)._M_string_length = 0;
    (__return_storage_ptr__->method).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->uri)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->uri).field_2
    ;
    (__return_storage_ptr__->uri)._M_string_length = 0;
    (__return_storage_ptr__->uri).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->versionMajor = 0;
    __return_storage_ptr__->versionMinor = 0;
    (__return_storage_ptr__->headers).
    super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->headers).
    super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->headers).
    super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->content).super__Vector_base<char,_std::allocator<char>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->content).super__Vector_base<char,_std::allocator<char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  }
  std::__cxx11::string::~string((string *)&parser.contentSize);
  httpparser::Request::~Request((Request *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

Request parse(const char *s, size_t size)
    {
        Request request;
        HttpRequestParser parser;
        
        HttpRequestParser::ParseResult res = parser.parse(request, s, s + size);
        
        if( res != HttpRequestParser::ParsingCompleted )
            return Request();
        else
            return request;
    }